

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O0

Vec_Int_t * Acec_RewriteTop(Gia_Man_t *p,Acec_Box_t *pBox)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar3;
  int local_54;
  int local_50;
  int Out [2];
  int In [3];
  int Count;
  int Driver;
  int iLit;
  int iStart;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vRes;
  Acec_Box_t *pBox_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCoNum(p);
  p_00 = Vec_IntAlloc(iVar1 + 1);
  In[1] = 0;
  pObj = Gia_ManCo(p,0);
  iVar1 = Gia_ObjFaninId0p(p,pObj);
  for (Driver = 0; iVar2 = Vec_WecSize(pBox->vRootLits), Driver < iVar2; Driver = Driver + 1) {
    pVVar3 = Vec_WecEntry(pBox->vRootLits,Driver);
    iVar2 = Vec_IntEntry(pVVar3,0);
    iVar2 = Abc_Lit2Var(iVar2);
    if (iVar2 == iVar1) break;
  }
  iVar1 = Gia_ManCoNum(p);
  if (iVar1 <= Driver) {
    __assert_fail("iStart < Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                  ,0x167,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
  }
  iStart = Driver;
  while( true ) {
    iVar1 = Vec_WecSize(pBox->vRootLits);
    if (iVar1 <= iStart) {
      iVar1 = Vec_IntSize(p_00);
      iVar2 = Gia_ManCoNum(p);
      if (iVar2 <= iVar1) {
        iVar1 = Gia_ManCoNum(p);
        Vec_IntShrink(p_00,iVar1);
        printf("Added %d adders for replace CLAs.  ",(ulong)(uint)In[1]);
        return p_00;
      }
      __assert_fail("Vec_IntSize(vRes) >= Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                    ,0x17d,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
    }
    pVVar3 = Vec_WecEntry(pBox->vRootLits,iStart);
    memset(Out,0,0xc);
    iVar1 = Vec_IntSize(pVVar3);
    if (iVar1 < 1) break;
    iVar1 = Vec_IntSize(pVVar3);
    if (3 < iVar1) {
      __assert_fail("Vec_IntSize(vLevel) <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                    ,0x16d,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
    }
    iVar1 = Vec_IntSize(pVVar3);
    if (iVar1 == 1) {
      iVar1 = Vec_IntEntry(pVVar3,0);
      Vec_IntPush(p_00,iVar1);
    }
    else {
      for (iLit = 0; iVar1 = Vec_IntSize(pVVar3), iLit < iVar1; iLit = iLit + 1) {
        iVar1 = Vec_IntEntry(pVVar3,iLit);
        Out[iLit] = iVar1;
      }
      Acec_InsertFadd(p,Out,&local_54);
      Vec_IntPush(p_00,local_54);
      iVar1 = Vec_WecSize(pBox->vRootLits);
      if (iStart + 1 < iVar1) {
        pVVar3 = Vec_WecEntry(pBox->vRootLits,iStart + 1);
        Vec_IntPush(pVVar3,local_50);
      }
      else {
        pVVar3 = Vec_WecPushLevel(pBox->vRootLits);
        Vec_IntPush(pVVar3,local_50);
      }
      In[1] = In[1] + 1;
    }
    iStart = iStart + 1;
  }
  __assert_fail("Vec_IntSize(vLevel) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                ,0x16c,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
}

Assistant:

Vec_Int_t * Acec_RewriteTop( Gia_Man_t * p, Acec_Box_t * pBox )
{
    Vec_Int_t * vRes = Vec_IntAlloc( Gia_ManCoNum(p) + 1 );
    Vec_Int_t * vLevel;
    int i, k, iStart, iLit, Driver, Count = 0;
    // determine how much to shift
    Driver = Gia_ObjFaninId0p( p, Gia_ManCo(p, 0) );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, iStart )
        if ( Abc_Lit2Var(Vec_IntEntry(vLevel,0)) == Driver )
            break;
    assert( iStart < Gia_ManCoNum(p) );
    //Vec_WecPrintLits( pBox->vRootLits );
    Vec_WecForEachLevelStart( pBox->vRootLits, vLevel, i, iStart )
    {
        int In[3] = {0}, Out[2];
        assert( Vec_IntSize(vLevel) > 0 );
        assert( Vec_IntSize(vLevel) <= 3 );
        if ( Vec_IntSize(vLevel) == 1 )
        {
            Vec_IntPush( vRes, Vec_IntEntry(vLevel, 0) );
            continue;
        }
        Vec_IntForEachEntry( vLevel, iLit, k )
            In[k] = iLit;
        Acec_InsertFadd( p, In, Out );
        Vec_IntPush( vRes, Out[0] );
        if ( i+1 < Vec_WecSize(pBox->vRootLits) )
            Vec_IntPush( Vec_WecEntry(pBox->vRootLits, i+1), Out[1] );
        else
            Vec_IntPush( Vec_WecPushLevel(pBox->vRootLits), Out[1] );
        Count++;
    }
    assert( Vec_IntSize(vRes) >= Gia_ManCoNum(p) );
    Vec_IntShrink( vRes, Gia_ManCoNum(p) );
    printf( "Added %d adders for replace CLAs.  ", Count );
    return vRes;
}